

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O1

void internal_convert_record
               (IOConversionPtr conv,ConvStatus conv_status,void *src,void *dest,
               int data_already_copied)

{
  IOconvFieldStruct *conv_00;
  int iVar1;
  FMTypeEnum FVar2;
  FMdata_type FVar3;
  FMFormat_conflict p_Var4;
  FMVarInfoStruct *pFVar5;
  int iVar6;
  size_t sVar7;
  size_t *__s;
  char *src_field_addr;
  long lVar8;
  FMTypeDesc *pFVar9;
  void *dest_field;
  char *dest_field_addr;
  long lVar10;
  _FMgetFieldStruct tmp_src_spec;
  _FMgetFieldStruct local_58;
  void *local_38;
  
  if (conv->conversion_type != none_required) {
    local_38 = dest;
    if (conv->conv_count < 1) {
      __s = (size_t *)0x0;
    }
    else {
      lVar10 = 0;
      __s = (size_t *)0x0;
      do {
        pFVar9 = &(conv->conversions[lVar10].iovar)->type_desc;
        do {
          if ((pFVar9->type == FMType_array) && (pFVar9->static_size == 0)) {
            p_Var4 = conv->ioformat->body;
            local_58.offset = (size_t)p_Var4->field_list[pFVar9->control_field_index].field_offset;
            local_58.data_type = integer_type;
            local_58.size = p_Var4->field_list[pFVar9->control_field_index].field_size;
            local_58._17_7_ = 0;
            local_58.byte_swap = (byte)p_Var4->byte_reversal;
            sVar7 = get_big_int(&local_58,src);
            if (__s == (size_t *)0x0) {
              __s = (size_t *)ffs_malloc((long)p_Var4->field_count << 3);
              if (0 < (long)p_Var4->field_count) {
                memset(__s,0,(long)p_Var4->field_count << 3);
              }
              conv_status->control_value = __s;
            }
            __s[pFVar9->control_field_index] = sVar7;
          }
          pFVar9 = pFVar9->next;
        } while (pFVar9 != (FMTypeDesc *)0x0);
        lVar10 = lVar10 + 1;
      } while (lVar10 < conv->conv_count);
    }
    if (0 < conv->conv_count) {
      lVar10 = 0;
      do {
        pFVar5 = conv->conversions[lVar10].iovar;
        iVar6 = 1;
        if (pFVar5 != (FMVarInfoStruct *)0x0) {
          iVar6 = 1;
          if (0 < (long)pFVar5->dimen_count) {
            iVar6 = 1;
            lVar8 = 0;
            do {
              iVar1 = pFVar5->dimens[lVar8].static_size;
              if (iVar1 == 0) {
                iVar6 = -1;
                break;
              }
              iVar6 = iVar6 * iVar1;
              lVar8 = lVar8 + 1;
            } while (pFVar5->dimen_count != lVar8);
          }
        }
        conv_00 = conv->conversions + lVar10;
        src_field_addr = (char *)((conv_00->src_field).offset + (long)src);
        dest_field_addr = (char *)(conv_00->dest_offset + (long)local_38);
        if (conv_00->default_value == (void *)0x0) {
          iVar1 = (conv_00->src_field).size;
          if (((((iVar1 != 1) && ((conv_00->src_field).byte_swap != '\0')) ||
               (iVar1 != conv_00->dest_size)) ||
              ((conv_00->subconversion != (IOConversionPtr)0x0 ||
               (FVar2 = (pFVar5->type_desc).type, FVar2 == FMType_pointer)))) ||
             ((FVar2 == FMType_string || ((iVar6 == -1 || (conv_00->rc_swap != no_row_column_swap)))
              ))) goto LAB_00111b83;
          FVar3 = (conv_00->src_field).data_type;
          if (FVar3 == string_type) {
            if (conv_status->dest_pointer_base == (void *)0x0) goto LAB_00111bff;
            goto LAB_00111b83;
          }
          if ((FVar3 == float_type) &&
             ((conv_00->src_field).src_float_format != (conv_00->src_field).target_float_format))
          goto LAB_00111b83;
LAB_00111bff:
          memcpy(dest_field_addr,src_field_addr,(long)(iVar1 * iVar6));
        }
        else {
          memcpy(dest_field_addr,conv_00->default_value,(long)conv_00->dest_size);
LAB_00111b83:
          new_convert_field(src_field_addr,dest_field_addr,conv_status,conv_00,&pFVar5->type_desc,1)
          ;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < conv->conv_count);
    }
    if (__s != (size_t *)0x0) {
      free(__s);
      return;
    }
  }
  return;
}

Assistant:

static void
internal_convert_record(IOConversionPtr conv, ConvStatus conv_status, void *src,
			void *dest, int data_already_copied)
{
    int i;
    size_t *control_value = NULL;
    if (conv->conversion_type == none_required) return;
    for (i = 0; i < conv->conv_count; i++) {
	FMTypeDesc *next = &conv->conversions[i].iovar->type_desc;
	while (next != NULL) {
	    if ((next->type == FMType_array) && 
		(next->static_size == 0)) {
		size_t elements;
		FMFormat f = conv->ioformat->body;
		int field = next->control_field_index;
		struct _FMgetFieldStruct tmp_src_spec;
		memset(&tmp_src_spec, 0, sizeof(tmp_src_spec));
		tmp_src_spec.size = f->field_list[field].field_size;
		tmp_src_spec.offset = f->field_list[field].field_offset;
		tmp_src_spec.data_type = integer_type;
		tmp_src_spec.byte_swap = conv->ioformat->body->byte_reversal;
		elements = get_big_int(&tmp_src_spec, src);
		if (control_value == NULL) {
		    int j;
		    control_value = (size_t *) malloc(sizeof(control_value[0]) * f->field_count);
		    for (j = 0; j < f->field_count; j++)
			control_value[j] = 0;
		    conv_status->control_value = control_value;
		}
		control_value[next->control_field_index] = elements;
	    }
	    next = next->next;
	}
    }
    for (i = 0; i < conv->conv_count; i++) {
	FMFieldPtr src_spec = &conv->conversions[i].src_field;
	FMTypeDesc *type_desc = &conv->conversions[i].iovar->type_desc;
	int elements = get_static_array_element_count(conv->conversions[i].iovar);
	int byte_swap = conv->conversions[i].src_field.byte_swap;
	char *src_field_addr = (char*)src + src_spec->offset;
	char *dest_field_addr = (char*)dest + conv->conversions[i].dest_offset;

	if (conv->conversions[i].src_field.size == 1) byte_swap = 0;
	if (conv->conversions[i].default_value){
	    void *dest_field = (void *) (conv->conversions[i].dest_offset + 
					 (char *) dest);
	    memcpy(dest_field, conv->conversions[i].default_value, 
		   conv->conversions[i].dest_size);
	} else if (!byte_swap &&
		   (src_spec->size == conv->conversions[i].dest_size) &&
		   (conv->conversions[i].subconversion == NULL) &&
		   (type_desc->type != FMType_pointer) &&
		   (type_desc->type != FMType_string) &&
		   (elements != -1 /* var array */) &&
		   (conv->conversions[i].rc_swap == no_row_column_swap) &&
		   ((src_spec->data_type != float_type) || 
		    (src_spec->src_float_format == src_spec->target_float_format)) &&
		   ((src_spec->data_type != string_type) || 
		    ((conv_status->dest_pointer_base) == NULL))) {
	    /* data movement is all that is required */
	    memcpy(dest_field_addr, src_field_addr,
		   src_spec->size * elements);
	    continue;
	}
	new_convert_field(src_field_addr, dest_field_addr, conv_status, 
			  &conv->conversions[i], type_desc, 1);
    }
    if (control_value != NULL) {
	free(control_value);
    }
}